

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerDriver.cpp
# Opt level: O2

bool test_Player_getHand(bool verbose)

{
  CardType CVar1;
  vector<CardType,_std::allocator<CardType>_> *pvVar2;
  pointer pCVar3;
  pointer pCVar4;
  pointer pCVar5;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *ownedCountries;
  Hand *this;
  DiceRoller *this_00;
  Player *this_01;
  ostream *poVar6;
  CardType *i;
  pointer pCVar7;
  char *pcVar8;
  Deck deck;
  
  ownedCountries = (vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)operator_new(0x18);
  (ownedCountries->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (ownedCountries->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (ownedCountries->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this = (Hand *)operator_new(8);
  Hand::Hand(this);
  Deck::Deck(&deck,3);
  Deck::createDeck(&deck);
  Deck::draw(&deck,this);
  Deck::draw(&deck,this);
  Deck::draw(&deck,this);
  Deck::draw(&deck,this);
  this_00 = (DiceRoller *)operator_new(0x10);
  DiceRoller::DiceRoller(this_00);
  this_01 = (Player *)operator_new(0x38);
  Player::Player(this_01,ownedCountries,this,this_00,1);
  pvVar2 = this_01->pCards->handPointer;
  pCVar3 = (pvVar2->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pCVar4 = (pvVar2->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (verbose) {
    poVar6 = std::operator<<((ostream *)&std::cout,"\n");
    std::operator<<(poVar6,"\x1b[35m");
    pvVar2 = this_01->pCards->handPointer;
    pCVar5 = (pvVar2->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (pCVar7 = (pvVar2->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
                  super__Vector_impl_data._M_start; pCVar7 != pCVar5; pCVar7 = pCVar7 + 1) {
      CVar1 = *pCVar7;
      if (CVar1 == CAVALRY) {
        poVar6 = std::operator<<((ostream *)&std::cout,"player1 has a card ");
        pcVar8 = "CAVALRY";
LAB_00108ef5:
        poVar6 = std::operator<<(poVar6,pcVar8);
        std::endl<char,std::char_traits<char>>(poVar6);
      }
      else {
        if (CVar1 == ARTILLERY) {
          poVar6 = std::operator<<((ostream *)&std::cout,"player1 has a card ");
          pcVar8 = "ARTILLERY";
          goto LAB_00108ef5;
        }
        if (CVar1 == INFANTRY) {
          poVar6 = std::operator<<((ostream *)&std::cout,"player1 has a card ");
          pcVar8 = "INFANTRY";
          goto LAB_00108ef5;
        }
      }
    }
    std::operator<<((ostream *)&std::cout,"\x1b[31m");
  }
  Player::~Player(this_01);
  operator_delete(this_01,0x38);
  Deck::~Deck(&deck);
  return pCVar3 != pCVar4;
}

Assistant:

bool test_Player_getHand(bool verbose = false) {

    // Arrange
    bool success = true;
    auto* ownedCountries1 = new std::vector<Map::Country*>();
    auto* cards = new Hand();
    Deck deck = Deck(3);
    deck.createDeck();
    deck.draw(*cards);
    deck.draw(*cards);
    deck.draw(*cards);
    deck.draw(*cards);
    auto* diceRoller = new DiceRoller();

    // Act
    auto* player1 = new Player(ownedCountries1, cards, diceRoller, 1);

    // Assert
    if (player1->getCards()->getHand()->empty()) {
        success = false;
    }

    if (verbose) {
        std::cout << "\n" << "\033[35m";
        for (auto& i : *player1->getCards()->getHand()) {
            switch ((int) i) {
                case 0:
                    std::cout << "player1 has a card " << "INFANTRY" << std::endl;
                    break;
                case 1:
                    std::cout << "player1 has a card " << "ARTILLERY" << std::endl;
                    break;
                case 2:
                    std::cout << "player1 has a card " << "CAVALRY" << std::endl;
                    break;
            }
        }
        std::cout << "\033[31m";
    }
    delete player1;
    return success;
}